

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O0

void __thiscall
OpenMD::RNEMD::RNEMD::setMomentumFluxVector
          (RNEMD *this,vector<double,_std::allocator<double>_> *momentumFluxVector)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  double *pdVar4;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  if (sVar2 != 3) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    snprintf(painCave.errMsg,2000,
             "RNEMD: Incorrect number of parameters specified for momentumFluxVector.\n\tthere should be 3 parameters, but %zu were specified.\n"
             ,sVar2);
    painCave.isFatal = 1;
    simError();
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
  vVar1 = *pvVar3;
  pdVar4 = Vector3<double>::x((Vector3<double> *)(in_RDI + 0x1c80));
  *pdVar4 = vVar1;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,1);
  vVar1 = *pvVar3;
  pdVar4 = Vector3<double>::y((Vector3<double> *)(in_RDI + 0x1c80));
  *pdVar4 = vVar1;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,2);
  vVar1 = *pvVar3;
  pdVar4 = Vector3<double>::z((Vector3<double> *)(in_RDI + 0x1c80));
  *pdVar4 = vVar1;
  return;
}

Assistant:

void RNEMD::setMomentumFluxVector(
      const std::vector<RealType>& momentumFluxVector) {
    if (momentumFluxVector.size() != 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: Incorrect number of parameters specified for "
               "momentumFluxVector.\n"
               "\tthere should be 3 parameters, but %zu were specified.\n",
               momentumFluxVector.size());
      painCave.isFatal = 1;
      simError();
    }

    momentumFluxVector_.x() = momentumFluxVector[0];
    momentumFluxVector_.y() = momentumFluxVector[1];
    momentumFluxVector_.z() = momentumFluxVector[2];
  }